

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O2

void __thiscall
node::BlockManager::BlockManager(BlockManager *this,SignalInterrupt *interrupt,Options opts)

{
  _Rb_tree_header *p_Var1;
  path *__p;
  long lVar2;
  string_view source_file;
  path dir;
  path dir_00;
  char cVar3;
  bool bVar4;
  Logger *pLVar5;
  runtime_error *this_00;
  BlockManagerOpts *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  long in_FS_OFFSET;
  string_view logging_function;
  Span<std::byte> output;
  Span<const_unsigned_char> s;
  string_view str;
  Span<const_unsigned_char> s_00;
  undefined8 in_stack_fffffffffffffd98;
  char *in_stack_fffffffffffffda0;
  undefined8 in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb4;
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> _Var6;
  path local_220;
  path local_1f8;
  string local_1d0;
  string local_1b0;
  path local_190;
  path xor_key_path;
  array<std::byte,_8UL> xor_key;
  byte local_d8 [64];
  string local_98;
  string local_78;
  string log_msg;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  (this->cs_LastBlockFile).super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__list
  .__next = (__pthread_internal_list *)0x0;
  *(undefined8 *)
   ((long)&(this->cs_LastBlockFile).super_recursive_mutex.super___recursive_mutex_base._M_mutex +
   0x10) = 0;
  (this->cs_LastBlockFile).super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__list
  .__prev = (__pthread_internal_list *)0x0;
  (this->cs_LastBlockFile).super_recursive_mutex.super___recursive_mutex_base._M_mutex.__align = 0;
  *(undefined8 *)
   ((long)&(this->cs_LastBlockFile).super_recursive_mutex.super___recursive_mutex_base._M_mutex + 8)
       = 0;
  (this->cs_LastBlockFile).super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__kind
       = 1;
  (this->m_blockfile_info).super__Vector_base<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_blockfile_info).super__Vector_base<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_blockfile_info).super__Vector_base<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_blockfile_cursors)._M_elems[0].super__Optional_base<node::BlockfileCursor,_true,_true>.
  _M_payload.super__Optional_payload_base<node::BlockfileCursor>._M_payload =
       (_Storage<node::BlockfileCursor,_true>)0x0;
  *(undefined8 *)
   &(this->m_blockfile_cursors)._M_elems[0].super__Optional_base<node::BlockfileCursor,_true,_true>.
    _M_payload.super__Optional_payload_base<node::BlockfileCursor>._M_engaged = 1;
  *(undefined8 *)
   ((long)&(this->m_blockfile_cursors)._M_elems[1].
           super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
           super__Optional_payload_base<node::BlockfileCursor>._M_payload + 4) = 0;
  this->m_check_for_pruning = false;
  this->m_prune_mode = in_RDX->prune_target != 0;
  xor_key._M_elems[0] = 0;
  xor_key._M_elems[1] = 0;
  xor_key._M_elems[2] = 0;
  xor_key._M_elems[3] = 0;
  xor_key._M_elems[4] = 0;
  xor_key._M_elems[5] = 0;
  xor_key._M_elems[6] = 0;
  xor_key._M_elems[7] = 0;
  if ((in_RDX->use_xor == true) &&
     (cVar3 = std::filesystem::is_empty(&(in_RDX->blocks_dir).super_path), cVar3 != '\0')) {
    FastRandomContext::FastRandomContext((FastRandomContext *)&xor_key_path,false);
    output.m_size = 8;
    output.m_data = xor_key._M_elems;
    FastRandomContext::fillrand((FastRandomContext *)&xor_key_path,output);
    ChaCha20::~ChaCha20((ChaCha20 *)&xor_key_path.super_path._M_pathname.field_2);
  }
  std::filesystem::__cxx11::path::path(&local_190,&(in_RDX->blocks_dir).super_path);
  fs::path::operator/=((path *)&local_190,"xor.dat");
  std::filesystem::__cxx11::path::path(&xor_key_path.super_path,&local_190);
  std::filesystem::__cxx11::path::~path(&local_190);
  bVar4 = std::filesystem::exists(&xor_key_path.super_path);
  if (bVar4) {
    log_msg._M_dataplus._M_p = (pointer)fsbridge::fopen((char *)&xor_key_path,"rb");
    log_msg._M_string_length = 0;
    log_msg.field_2._M_allocated_capacity = 0;
    log_msg.field_2._8_8_ = 0;
    _Var6._M_head_impl = (_Impl *)0x0;
    std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
              ((_Vector_base<std::byte,_std::allocator<std::byte>_> *)&stack0xfffffffffffffdb8);
    Unserialize<AutoFile,_std::byte,_8UL>((AutoFile *)&log_msg,&xor_key);
  }
  else {
    log_msg._M_dataplus._M_p = (pointer)fsbridge::fopen((char *)&xor_key_path,"wbx");
    log_msg._M_string_length = 0;
    log_msg.field_2._M_allocated_capacity = 0;
    log_msg.field_2._8_8_ = 0;
    _Var6._M_head_impl = (_Impl *)0x0;
    std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
              ((_Vector_base<std::byte,_std::allocator<std::byte>_> *)&stack0xfffffffffffffdb8);
    Serialize<AutoFile,_std::byte,_8UL>((AutoFile *)&log_msg,&xor_key);
  }
  AutoFile::~AutoFile((AutoFile *)&log_msg);
  if (in_RDX->use_xor == false) {
    log_msg._M_dataplus._M_p = (pointer)0x0;
    bVar4 = std::operator==(&xor_key,(array<std::byte,_8UL> *)&log_msg);
    if (!bVar4) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      s_00.m_size = 8;
      s_00.m_data = xor_key._M_elems;
      HexStr_abi_cxx11_(&local_78,s_00);
      std::filesystem::__cxx11::path::string(&local_98,&xor_key_path.super_path);
      tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                (&log_msg,(tinyformat *)
                          "The blocksdir XOR-key can not be disabled when a random key was already stored! Stored key: \'%s\', stored path: \'%s\'."
                 ,(char *)&local_78,&local_98,in_R8);
      std::runtime_error::runtime_error(this_00,(string *)&log_msg);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_001e3996;
    }
  }
  std::filesystem::__cxx11::path::string(&local_1b0,&(in_RDX->blocks_dir).super_path);
  s.m_size = 8;
  s.m_data = xor_key._M_elems;
  HexStr_abi_cxx11_(&local_1d0,s);
  pLVar5 = LogInstance();
  bVar4 = BCLog::Logger::Enabled(pLVar5);
  if (bVar4) {
    log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
    log_msg._M_string_length = 0;
    log_msg.field_2._M_allocated_capacity =
         log_msg.field_2._M_allocated_capacity & 0xffffffffffffff00;
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              (&local_78,
               (tinyformat *)"Using obfuscation key for blocksdir *.dat files (%s): \'%s\'\n",
               (char *)&local_1b0,&local_1d0,in_R8);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&log_msg,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    pLVar5 = LogInstance();
    local_78._M_dataplus._M_p = (pointer)0x5e;
    local_78._M_string_length = 0x6a18e9;
    in_stack_fffffffffffffd98 = 0x5e;
    in_stack_fffffffffffffda0 =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
    ;
    in_stack_fffffffffffffdb0 = 2;
    in_stack_fffffffffffffda8 = 0xffffffffffffffff;
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
    ;
    source_file._M_len = 0x5e;
    logging_function._M_str = "InitBlocksdirXorKey";
    logging_function._M_len = 0x13;
    str._M_str = log_msg._M_dataplus._M_p;
    str._M_len = log_msg._M_string_length;
    BCLog::Logger::LogPrintStr(pLVar5,str,logging_function,source_file,0x4a0,ALL,Info);
    std::__cxx11::string::~string((string *)&log_msg);
  }
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::vector<std::byte,std::allocator<std::byte>>::vector<std::byte*,void>
            ((vector<std::byte,std::allocator<std::byte>> *)&this->m_xor_key,xor_key._M_elems,
             local_d8,(allocator_type *)&log_msg);
  std::filesystem::__cxx11::path::~path(&xor_key_path.super_path);
  p_Var1 = &(this->m_dirty_blockindex)._M_t._M_impl.super__Rb_tree_header;
  (this->m_dirty_blockindex)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_dirty_blockindex)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->m_dirty_blockindex)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_dirty_blockindex)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_dirty_blockindex)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_dirty_fileinfo)._M_t._M_impl.super__Rb_tree_header;
  (this->m_dirty_fileinfo)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_dirty_fileinfo)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_dirty_fileinfo)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->m_dirty_fileinfo)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_dirty_fileinfo)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_prune_locks)._M_h._M_buckets = &(this->m_prune_locks)._M_h._M_single_bucket;
  (this->m_prune_locks)._M_h._M_bucket_count = 1;
  (this->m_prune_locks)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_prune_locks)._M_h._M_element_count = 0;
  (this->m_prune_locks)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_prune_locks)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_prune_locks)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  kernel::BlockManagerOpts::BlockManagerOpts(&this->m_opts,in_RDX);
  __p = &(this->m_opts).blocks_dir;
  std::filesystem::__cxx11::path::path(&local_1f8,&__p->super_path);
  dir.super_path._M_pathname._M_string_length = (size_type)in_stack_fffffffffffffda0;
  dir.super_path._M_pathname._M_dataplus._M_p = (pointer)in_stack_fffffffffffffd98;
  dir.super_path._M_pathname.field_2._M_allocated_capacity = in_stack_fffffffffffffda8;
  dir.super_path._M_pathname.field_2._8_4_ = in_stack_fffffffffffffdb0;
  dir.super_path._M_pathname.field_2._12_4_ = in_stack_fffffffffffffdb4;
  dir.super_path._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          )_Var6._M_head_impl;
  FlatFileSeq::FlatFileSeq(&this->m_block_file_seq,dir,(char *)&local_1f8,0x6d8f1c);
  std::filesystem::__cxx11::path::~path(&local_1f8);
  std::filesystem::__cxx11::path::path(&local_220,&__p->super_path);
  dir_00.super_path._M_pathname._M_string_length = (size_type)in_stack_fffffffffffffda0;
  dir_00.super_path._M_pathname._M_dataplus._M_p = (pointer)in_stack_fffffffffffffd98;
  dir_00.super_path._M_pathname.field_2._M_allocated_capacity = in_stack_fffffffffffffda8;
  dir_00.super_path._M_pathname.field_2._8_4_ = in_stack_fffffffffffffdb0;
  dir_00.super_path._M_pathname.field_2._12_4_ = in_stack_fffffffffffffdb4;
  dir_00.super_path._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          )_Var6._M_head_impl;
  FlatFileSeq::FlatFileSeq(&this->m_undo_file_seq,dir_00,(char *)&local_220,0x6ca415);
  std::filesystem::__cxx11::path::~path(&local_220);
  this->m_interrupt = interrupt;
  this->m_importing = (__atomic_base<bool>)0x0;
  this->m_blockfiles_indexed = (__atomic_base<bool>)0x1;
  (this->m_block_index)._M_h._M_buckets = &(this->m_block_index)._M_h._M_single_bucket;
  (this->m_block_index)._M_h._M_bucket_count = 1;
  (this->m_block_index)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_block_index)._M_h._M_element_count = 0;
  (this->m_block_index)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_block_index)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_block_index)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->m_snapshot_height).super__Optional_base<int,_true,_true>._M_payload.
  super__Optional_payload_base<int>._M_engaged = false;
  (this->m_blocks_unlinked)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_blocks_unlinked)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->m_blocks_unlinked)._M_t._M_impl.super__Rb_tree_header;
  (this->m_blocks_unlinked)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_blocks_unlinked)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_blocks_unlinked)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_block_tree_db)._M_t.
  super___uniq_ptr_impl<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_>._M_t.
  super__Tuple_impl<0UL,_kernel::BlockTreeDB_*,_std::default_delete<kernel::BlockTreeDB>_>.
  super__Head_base<0UL,_kernel::BlockTreeDB_*,_false>._M_head_impl = (BlockTreeDB *)0x0;
  this->m_have_pruned = false;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
LAB_001e3996:
  __stack_chk_fail();
}

Assistant:

BlockManager::BlockManager(const util::SignalInterrupt& interrupt, Options opts)
    : m_prune_mode{opts.prune_target > 0},
      m_xor_key{InitBlocksdirXorKey(opts)},
      m_opts{std::move(opts)},
      m_block_file_seq{FlatFileSeq{m_opts.blocks_dir, "blk", m_opts.fast_prune ? 0x4000 /* 16kB */ : BLOCKFILE_CHUNK_SIZE}},
      m_undo_file_seq{FlatFileSeq{m_opts.blocks_dir, "rev", UNDOFILE_CHUNK_SIZE}},
      m_interrupt{interrupt} {}